

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_write.c
# Opt level: O0

void xlsxiowrite_add_cell_string(xlsxiowriter handle,char *value)

{
  char *value_local;
  xlsxiowriter handle_local;
  
  if (value == (char *)0x0) {
    write_cell_data(handle,(char *)0x0,"<c s=\"3\" r=\"%s%lu\"/>",(char *)0x0,(char *)0x0);
  }
  else {
    write_cell_data(handle,(char *)0x0,
                    "<c t=\"inlineStr\" s=\"3\" r=\"%s%lu\"><is xml:space=\"preserve\"><t>",
                    "</t></is></c>","%s",value);
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxiowrite_add_cell_string (xlsxiowriter handle, const char* value)
{
  if (value) {
    if (need_space_preserve_attr(value))
      write_cell_data(handle, NULL, "<c t=\"inlineStr\"" STYLE_ATTR(STYLE_TEXT) COLNRTAG "><is xml:space=\"preserve\"><t>", "</t></is></c>", "%s", value);
    else
      write_cell_data(handle, NULL, "<c t=\"inlineStr\"" STYLE_ATTR(STYLE_TEXT) COLNRTAG "><is><t>", "</t></is></c>", "%s", value);
  } else {
    write_cell_data(handle, NULL, "<c" STYLE_ATTR(STYLE_TEXT) COLNRTAG "/>", NULL, NULL);
  }
}